

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Maybe<kj::Own<const_kj::ReadableFile>_> __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenFile(DiskHandle *this,PathPtr path)

{
  AutoCloseFd *other;
  ReadableFile *extraout_RDX;
  ReadableFile *extraout_RDX_00;
  ReadableFile *extraout_RDX_01;
  ReadableFile *pRVar1;
  Maybe<kj::Own<const_kj::ReadableFile>_> MVar2;
  AutoCloseFd local_88;
  Own<kj::ReadableFile> local_80;
  AutoCloseFd local_6c;
  AutoCloseFd result;
  Fault local_58;
  Fault f;
  undefined1 auStack_48 [4];
  int error;
  String *local_40;
  PathPtr *local_38;
  int local_30;
  int local_2c;
  int _kjSyscallError;
  int newFd;
  DiskHandle *this_local;
  PathPtr path_local;
  
  this_local = (DiskHandle *)path.parts.size_;
  local_40 = path.parts.ptr;
  _auStack_48 = &local_2c;
  local_38 = (PathPtr *)&this_local;
  __kjSyscallError = local_40;
  path_local.parts.size_ = (size_t)this;
  f.exception._4_4_ =
       kj::_::Debug::
       syscallError<kj::(anonymous_namespace)::DiskHandle::tryOpenFile(kj::PathPtr)const::_lambda()_1_>
                 ((anon_class_24_3_ffa5648e *)auStack_48,false);
  local_30 = f.exception._4_4_;
  if (f.exception._4_4_ == 0) {
    AutoCloseFd::AutoCloseFd(&local_6c,local_2c);
    other = mv<kj::AutoCloseFd>(&local_6c);
    AutoCloseFd::AutoCloseFd(&local_88,other);
    newDiskReadableFile((kj *)&local_80,&local_88);
    Maybe<kj::Own<const_kj::ReadableFile>_>::Maybe<kj::ReadableFile>
              ((Maybe<kj::Own<const_kj::ReadableFile>_> *)this,&local_80);
    Own<kj::ReadableFile>::~Own(&local_80);
    AutoCloseFd::~AutoCloseFd(&local_88);
    AutoCloseFd::~AutoCloseFd(&local_6c);
    pRVar1 = extraout_RDX_01;
  }
  else if ((f.exception._4_4_ == 2) || (f.exception._4_4_ == 0x14)) {
    Maybe<kj::Own<const_kj::ReadableFile>_>::Maybe
              ((Maybe<kj::Own<const_kj::ReadableFile>_> *)this,(void *)0x0);
    pRVar1 = extraout_RDX;
  }
  else {
    kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
              (&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x2e9,f.exception._4_4_,"openat(fd, path, O_RDONLY)","path",(PathPtr *)&this_local);
    Maybe<kj::Own<const_kj::ReadableFile>_>::Maybe
              ((Maybe<kj::Own<const_kj::ReadableFile>_> *)this,(void *)0x0);
    kj::_::Debug::Fault::~Fault(&local_58);
    pRVar1 = extraout_RDX_00;
  }
  MVar2.ptr.ptr = pRVar1;
  MVar2.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableFile>_>)MVar2.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const {
    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(
        fd, path.toString().cStr(), O_RDONLY | MAYBE_O_CLOEXEC)) {
      case ENOENT:
      case ENOTDIR:
        return nullptr;
      default:
        KJ_FAIL_SYSCALL("openat(fd, path, O_RDONLY)", error, path) { return nullptr; }
    }

    kj::AutoCloseFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return newDiskReadableFile(kj::mv(result));
  }